

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

int fminnewt(custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,double delta,
            double *dx,double fsval,double maxstep,int method,double *xf)

{
  double __x;
  double dVar1;
  double stol;
  double gtol;
  double eps;
  int niter;
  int MAXITER;
  int retval;
  int method_local;
  double maxstep_local;
  double fsval_local;
  double *dx_local;
  double delta_local;
  double *xi_local;
  custom_gradient *pcStack_18;
  int N_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  eps._4_4_ = N * 200;
  eps._0_4_ = 0;
  MAXITER = method;
  _retval = maxstep;
  maxstep_local = fsval;
  fsval_local = (double)dx;
  dx_local = (double *)delta;
  delta_local = (double)xi;
  xi_local._4_4_ = N;
  pcStack_18 = funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  __x = macheps();
  if (MAXITER == 1) {
    dVar1 = pow(__x,0.3333333333333333);
    if (eps._4_4_ < 1000) {
      eps._4_4_ = 1000;
    }
    niter = newton_min_func((custom_function *)funcgrad_local,pcStack_18,(double *)delta_local,
                            xi_local._4_4_,(double *)fsval_local,maxstep_local,_retval,eps._4_4_,
                            (int *)&eps,__x,dVar1,dVar1 * dVar1,xf);
  }
  else if (MAXITER == 2) {
    dVar1 = pow(__x,0.3333333333333333);
    if (eps._4_4_ < 1000) {
      eps._4_4_ = 1000;
    }
    niter = newton_min_trust((custom_function *)funcgrad_local,pcStack_18,(double *)delta_local,
                             xi_local._4_4_,(double *)fsval_local,maxstep_local,(double)dx_local,0,
                             eps._4_4_,(int *)&eps,__x,dVar1,dVar1 * dVar1,xf);
  }
  else {
    if (MAXITER != 3) {
      printf("Method Value should be one of 1,2 or 3. See Documentation. \n");
      exit(1);
    }
    dVar1 = pow(__x,0.3333333333333333);
    if (eps._4_4_ < 1000) {
      eps._4_4_ = 1000;
    }
    niter = newton_min_trust((custom_function *)funcgrad_local,pcStack_18,(double *)delta_local,
                             xi_local._4_4_,(double *)fsval_local,maxstep_local,(double)dx_local,1,
                             eps._4_4_,(int *)&eps,__x,dVar1,dVar1 * dVar1,xf);
  }
  return niter;
}

Assistant:

int fminnewt(custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,
	     double delta,double *dx,double fsval,double maxstep, int method,double *xf) {
	int retval;
	int MAXITER,niter;
	double eps,gtol,stol;
	/*

	 * Method 1 - Newton Line Search
	 * Method 2 - Newton Trust Region - Hook Step
	 * Method 3 - Newton Trust Region - Double Dog-Leg
	 *
	 * Default Values :
	 *
	 * fsval = 1.0
	 * delta = -1.0
	 * dx = {1.0,1.0,...} - 1XN vector

	 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occured.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */

	MAXITER = 200*N;
	niter = 0;

	eps = macheps(); // Use macheps program

	if (method == 1) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_func(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 2) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,0,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 3) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,1,MAXITER,&niter,eps,gtol,stol,xf);
	} else {
		printf("Method Value should be one of 1,2 or 3. See Documentation. \n");
		exit(1);
	}


	return retval;
}